

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadS64Leb128
          (BinaryReader *this,uint64_t *out_value,char *desc)

{
  size_t sVar1;
  size_t bytes_read;
  uint8_t *end;
  uint8_t *p;
  char *desc_local;
  uint64_t *out_value_local;
  BinaryReader *this_local;
  
  sVar1 = wabt::ReadS64Leb128((this->state_).data + (this->state_).offset,
                              (this->state_).data + this->read_end_,out_value);
  if (sVar1 == 0) {
    PrintError(this,"unable to read i64 leb128: %s",desc);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    (this->state_).offset = sVar1 + (this->state_).offset;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadS64Leb128(uint64_t* out_value, const char* desc) {
  const uint8_t* p = state_.data + state_.offset;
  const uint8_t* end = state_.data + read_end_;
  size_t bytes_read = wabt::ReadS64Leb128(p, end, out_value);
  ERROR_UNLESS(bytes_read > 0, "unable to read i64 leb128: %s", desc);
  state_.offset += bytes_read;
  return Result::Ok;
}